

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::asio_rpc_client::sent
          (asio_rpc_client *this,ptr<req_msg> *req,ptr<buffer> *buf,rpc_handler *when_done,
          error_code err,size_t bytes_transferred)

{
  bool is_ssl;
  uint uVar1;
  pointer pcVar2;
  pointer pcVar3;
  byte *pbVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined1 local_169;
  ptr<rpc_exception> except;
  ptr<resp_msg> rsp;
  ptr<asio_rpc_client> self;
  mutable_buffers_1 local_128;
  byte local_118 [16];
  ptr<buffer> *local_108;
  undefined1 local_100 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  _Any_data local_e0;
  _Manager_type local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  ptr<buffer> resp_buf;
  
  uVar6 = err._M_value;
  std::__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::asio_rpc_client,void>
            ((__shared_ptr<nuraft::asio_rpc_client,(__gnu_cxx::_Lock_policy)2> *)&self,
             (__weak_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<nuraft::asio_rpc_client>);
  if (uVar6 == 0) {
    buffer::alloc((buffer *)&resp_buf,0x27);
    is_ssl = this->ssl_enabled_;
    pbVar4 = buffer::data(resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    local_128.super_mutable_buffer.size_ =
         buffer::size(resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     );
    local_100._0_8_ = response_read;
    local_100._8_8_ = 0;
    local_128.super_mutable_buffer.data_ = pbVar4;
    std::
    _Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>>
    ::
    _Tuple_impl<std::shared_ptr<nuraft::asio_rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
              ((_Tuple_impl<0ul,std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>>
                *)(local_100 + 0x10),&self,req,when_done,&resp_buf,
               (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
    aa::
    read<asio::mutable_buffers_1,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>
              (is_ssl,&this->ssl_socket_,&this->socket_,&local_128,
               (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>
                *)local_100);
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
    if (local_d0 != (_Manager_type)0x0) {
      (*local_d0)(&local_e0,&local_e0,__destroy_functor);
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
  }
  else {
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(&this->operation_timer_);
    LOCK();
    (this->abandoned_)._M_base._M_i = true;
    UNLOCK();
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar1 = (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_msg_base).dst_;
    pcVar2 = (this->host_)._M_dataplus._M_p;
    pcVar3 = (this->port_)._M_dataplus._M_p;
    (**(code **)(*(long *)err._M_cat + 0x20))(&local_128,err._M_cat,(ulong)uVar6);
    snprintf((char *)&resp_buf,100,"failed to send request to peer %d, %s:%s, error %d, %s",
             (ulong)uVar1,pcVar2,pcVar3,(ulong)uVar6,local_128.super_mutable_buffer.data_);
    except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_108 = &resp_buf;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::rpc_exception,std::allocator<nuraft::rpc_exception>,char_const*,std::shared_ptr<nuraft::req_msg>&>
              (&except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(rpc_exception **)&except,(allocator<nuraft::rpc_exception> *)&local_169
               ,(char **)&local_108,req);
    if ((byte *)local_128.super_mutable_buffer.data_ != local_118) {
      operator_delete(local_128.super_mutable_buffer.data_);
    }
    if ((when_done->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar5 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar5);
    }
    (*when_done->_M_invoker)((_Any_data *)when_done,&rsp,&except);
    resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (except.super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
           rsp.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    }
  }
  if (resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (resp_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (self.super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void sent( ptr<req_msg>& req,
               ptr<buffer>& buf,
               rpc_handler& when_done,
               std::error_code err,
               size_t bytes_transferred )
    {
        // Now we can safely free the `req_buf`.
        (void)buf;
        ptr<asio_rpc_client> self(this->shared_from_this());
        if (!err) {
            // read a response
            ptr<buffer> resp_buf(buffer::alloc(RPC_RESP_HEADER_SIZE));
            aa::read( ssl_enabled_, ssl_socket_, socket_,
                      asio::buffer(resp_buf->data(), resp_buf->size()),
                      std::bind(&asio_rpc_client::response_read,
                                self,
                                req,
                                when_done,
                                resp_buf,
                                std::placeholders::_1,
                                std::placeholders::_2));

        } else {
            operation_timer_.cancel();
            abandoned_ = true;
            ptr<resp_msg> rsp;
            ptr<rpc_exception> except
                ( cs_new<rpc_exception>
                  ( sstrfmt( "failed to send request to peer %d, %s:%s, "
                             "error %d, %s" )
                           .fmt( req->get_dst(), host_.c_str(),
                                 port_.c_str(), err.value(), err.message().c_str() ),
                    req ) );
            close_socket();
            when_done(rsp, except);
        }
    }